

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_set.hpp
# Opt level: O1

pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
* __thiscall
pstore::index::
hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
::insert<pstore::indirect_string,void>
          (pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
           *__return_storage_ptr__,void *this,transaction_base *transaction,indirect_string *key)

{
  pair<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<false>,_bool>
  it;
  pair<pstore::indirect_string,_pstore::index::details::empty_class> local_138;
  pair<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<false>,_bool>
  local_110;
  
  local_138.first.field_2 = key->field_2;
  local_138.first.db_ = key->db_;
  local_138.first.is_pointer_ = key->is_pointer_;
  local_138.first._9_7_ = *(undefined7 *)&key->field_0x9;
  hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
  ::insert_or_upsert<std::pair<pstore::indirect_string,pstore::index::details::empty_class>>
            (&local_110,
             (hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
              *)((long)this + 8),transaction,&local_138,false);
  memcpy(&(__return_storage_ptr__->first).it_.visited_parents_,&local_110.first.visited_parents_,
         0xd8);
  (__return_storage_ptr__->first).it_.db_ = local_110.first.db_;
  (__return_storage_ptr__->first).it_.index_ = local_110.first.index_;
  (__return_storage_ptr__->first).it_.pos_._M_t.
  super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
  .
  super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
  ._M_head_impl = (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0;
  __return_storage_ptr__->second = local_110.second;
  if ((_Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
       )local_110.first.pos_._M_t.
        super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        .
        super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
        ._M_head_impl !=
      (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0) {
    operator_delete((void *)local_110.first.pos_._M_t.
                            super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
                            .
                            super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
                            ._M_head_impl,0x20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert (transaction_base & transaction,
                                              OtherKeyType const & key) {
                auto it = map_.insert (transaction, std::make_pair (key, details::empty_class ()));
                return {iterator{it.first}, it.second};
            }